

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_java.cpp
# Opt level: O1

void __thiscall
flatbuffers::java::JavaGenerator::GenStructPackCall_ObjectAPI
          (JavaGenerator *this,StructDef *struct_def,string *code,string *prefix)

{
  FieldDef *pFVar1;
  StructDef *struct_def_00;
  long *plVar2;
  long *plVar3;
  size_type *psVar4;
  pointer ppFVar5;
  long *local_b8;
  long local_b0;
  long local_a8;
  long lStack_a0;
  string *local_98;
  long *local_90 [2];
  long local_80 [2];
  JavaGenerator *local_70;
  IdlNamer *local_68;
  string *local_60;
  string local_58;
  StructDef *local_38;
  
  ppFVar5 = (struct_def->fields).vec.
            super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (ppFVar5 !=
      (struct_def->fields).vec.
      super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    local_68 = &this->namer_;
    local_98 = code;
    local_70 = this;
    local_60 = prefix;
    local_38 = struct_def;
    do {
      pFVar1 = *ppFVar5;
      struct_def_00 = (pFVar1->value).type.struct_def;
      if (struct_def_00 == (StructDef *)0x0) {
        std::__cxx11::string::append((char *)local_98);
        (*(local_68->super_Namer)._vptr_Namer[0x12])(local_90,local_68,pFVar1);
        plVar2 = (long *)std::__cxx11::string::replace
                                   ((ulong)local_90,0,(char *)0x0,
                                    (ulong)(local_60->_M_dataplus)._M_p);
        plVar3 = plVar2 + 2;
        if ((long *)*plVar2 == plVar3) {
          local_a8 = *plVar3;
          lStack_a0 = plVar2[3];
          local_b8 = &local_a8;
        }
        else {
          local_a8 = *plVar3;
          local_b8 = (long *)*plVar2;
        }
        local_b0 = plVar2[1];
        *plVar2 = (long)plVar3;
        plVar2[1] = 0;
        *(undefined1 *)(plVar2 + 2) = 0;
        std::__cxx11::string::_M_append((char *)local_98,(ulong)local_b8);
      }
      else {
        (*(local_68->super_Namer)._vptr_Namer[0x12])(local_90,local_68,pFVar1);
        plVar2 = (long *)std::__cxx11::string::replace
                                   ((ulong)local_90,0,(char *)0x0,
                                    (ulong)(local_60->_M_dataplus)._M_p);
        plVar3 = plVar2 + 2;
        if ((long *)*plVar2 == plVar3) {
          local_a8 = *plVar3;
          lStack_a0 = plVar2[3];
          local_b8 = &local_a8;
        }
        else {
          local_a8 = *plVar3;
          local_b8 = (long *)*plVar2;
        }
        local_b0 = plVar2[1];
        *plVar2 = (long)plVar3;
        plVar2[1] = 0;
        *(undefined1 *)(plVar2 + 2) = 0;
        plVar2 = (long *)std::__cxx11::string::append((char *)&local_b8);
        psVar4 = (size_type *)(plVar2 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar2 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar4) {
          local_58.field_2._M_allocated_capacity = *psVar4;
          local_58.field_2._8_8_ = plVar2[3];
          local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
        }
        else {
          local_58.field_2._M_allocated_capacity = *psVar4;
          local_58._M_dataplus._M_p = (pointer)*plVar2;
        }
        local_58._M_string_length = plVar2[1];
        *plVar2 = (long)psVar4;
        plVar2[1] = 0;
        *(undefined1 *)(plVar2 + 2) = 0;
        GenStructPackCall_ObjectAPI(local_70,struct_def_00,local_98,&local_58);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_dataplus._M_p != &local_58.field_2) {
          operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
        }
      }
      if (local_b8 != &local_a8) {
        operator_delete(local_b8,local_a8 + 1);
      }
      if (local_90[0] != local_80) {
        operator_delete(local_90[0],local_80[0] + 1);
      }
      ppFVar5 = ppFVar5 + 1;
    } while (ppFVar5 !=
             (local_38->fields).vec.
             super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
             _M_impl.super__Vector_impl_data._M_finish);
  }
  return;
}

Assistant:

void GenStructPackCall_ObjectAPI(const StructDef &struct_def,
                                   std::string &code,
                                   std::string prefix) const {
    for (auto it = struct_def.fields.vec.begin();
         it != struct_def.fields.vec.end(); ++it) {
      auto &field = **it;
      const auto &field_type = field.value.type;
      if (field_type.struct_def != nullptr) {
        GenStructPackCall_ObjectAPI(*field_type.struct_def, code,
                                    prefix + namer_.Field(field) + "_");
      } else {
        code += ",\n";
        code += prefix + namer_.Field(field);
      }
    }
  }